

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dacload.c
# Opt level: O0

void envy_bios_print_dacload(envy_bios *bios,FILE *out,uint mask)

{
  envy_bios_dacload *peVar1;
  envy_bios_dacload_entry *peVar2;
  envy_bios_dacload_entry *entry;
  int i;
  envy_bios_dacload *dacload;
  uint mask_local;
  FILE *out_local;
  envy_bios *bios_local;
  
  peVar1 = &bios->dacload;
  if ((mask & 0x20) != 0) {
    if (peVar1->bit != (envy_bios_bit_entry *)0x0) {
      fprintf((FILE *)out,"BIT \'A\' unk02 0x%02x\n",(ulong)(bios->dacload).unk02);
      envy_bios_dump_hex(bios,out,(uint)peVar1->bit->t_offset,(uint)peVar1->bit->t_len,mask);
    }
    if ((bios->dacload).offset != 0) {
      if ((bios->dacload).valid == '\0') {
        fprintf((FILE *)out,"Failed to parse DACLOAD table at 0x%04x version %d.%d\n\n",
                (ulong)(bios->dacload).offset,(ulong)(uint)((int)(uint)(bios->dacload).version >> 4)
                ,(ulong)((bios->dacload).version & 0xf));
      }
      else {
        fprintf((FILE *)out,"DACLOAD table at 0x%04x version %d.%d\n",(ulong)(bios->dacload).offset,
                (ulong)(uint)((int)(uint)(bios->dacload).version >> 4),
                (ulong)((bios->dacload).version & 0xf));
        envy_bios_dump_hex(bios,out,(uint)(bios->dacload).offset,(uint)(bios->dacload).hlen,mask);
        for (entry._4_4_ = 0; (int)entry._4_4_ < (int)(uint)(bios->dacload).entriesnum;
            entry._4_4_ = entry._4_4_ + 1) {
          peVar2 = (bios->dacload).entries + (int)entry._4_4_;
          fprintf((FILE *)out,"DACLOAD %d: 0x%08x\n",(ulong)entry._4_4_,(ulong)peVar2->val);
          envy_bios_dump_hex(bios,out,(uint)peVar2->offset,(uint)(bios->dacload).rlen,mask);
        }
        fprintf((FILE *)out,"\n");
      }
    }
  }
  return;
}

Assistant:

void envy_bios_print_dacload (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_dacload *dacload = &bios->dacload;
	if (!(mask & ENVY_BIOS_PRINT_DACLOAD))
		return;
	if (dacload->bit) {
		fprintf(out, "BIT 'A' unk02 0x%02x\n", dacload->unk02);
		envy_bios_dump_hex(bios, out, dacload->bit->t_offset, dacload->bit->t_len, mask);
	}
	if (!dacload->offset)
		return;
	if (!dacload->valid) {
		fprintf(out, "Failed to parse DACLOAD table at 0x%04x version %d.%d\n\n", dacload->offset, dacload->version >> 4, dacload->version & 0xf);
		return;
	}
	fprintf(out, "DACLOAD table at 0x%04x version %d.%d\n", dacload->offset, dacload->version >> 4, dacload->version & 0xf);
	envy_bios_dump_hex(bios, out, dacload->offset, dacload->hlen, mask);
	int i;
	for (i = 0; i < dacload->entriesnum; i++) {
		struct envy_bios_dacload_entry *entry = &dacload->entries[i];
		fprintf(out, "DACLOAD %d: 0x%08x\n", i, entry->val);
		envy_bios_dump_hex(bios, out, entry->offset, dacload->rlen, mask);
	}
	fprintf(out, "\n");
}